

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall
compressed_sparse_matrix<filtration_entry_t>::push_back
          (compressed_sparse_matrix<filtration_entry_t> *this,filtration_entry_t e)

{
  size_t sVar1;
  reference pvVar2;
  compressed_sparse_matrix<filtration_entry_t> *this_local;
  filtration_entry_t e_local;
  
  e_local.super_pair<float,_long>._0_8_ = e.super_pair<float,_long>.second;
  this_local._0_4_ = e.super_pair<float,_long>.first;
  sVar1 = size(this);
  if (sVar1 != 0) {
    std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>::push_back
              (&this->entries,(value_type *)&this_local);
    pvVar2 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->bounds);
    *pvVar2 = *pvVar2 + 1;
    return;
  }
  __assert_fail("0 < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JasonPSmith[P]tournser/pytournser/../tournser.cpp"
                ,0xbb,
                "void compressed_sparse_matrix<filtration_entry_t>::push_back(ValueType) [ValueType = filtration_entry_t]"
               );
}

Assistant:

void push_back(ValueType e) {
		assert(0 < size());
		entries.push_back(e);
		++bounds.back();
	}